

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase331::run(TestCase331 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  char cVar5;
  byte bVar6;
  Which WVar7;
  short sVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  char *pcVar11;
  Exception *pEVar12;
  bool bVar13;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,_capnproto_test::capnp::test::TestUnion::Union0::Which>
  _kjCondition;
  undefined1 local_838;
  undefined7 uStack_837;
  undefined1 local_830;
  undefined2 local_82c;
  undefined4 local_828;
  Builder root;
  Fault f;
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 local_668;
  undefined1 local_4d8 [2];
  undefined1 auStack_4d6 [406];
  Reader local_340;
  char *local_2f8 [51];
  Builder local_160;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&_kjCondition,&builder.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&root,
             (EVP_PKEY_CTX *)(schemas::s_f47697362233ce52 + 0x48));
  name.content.size_ = 7;
  name.content.ptr = "union0";
  DynamicStruct::Builder::get((Builder *)&f,&root,name);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d8,(Builder *)&f);
  _kjCondition.left = U0F0S16;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = (char *)((long)&__DT_RELA[0x1caa].r_addend + 7);
  name_04.content.size_ = 8;
  name_04.content.ptr = "u0f1s32";
  DynamicStruct::Builder::set((Builder *)local_4d8,name_04,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_00.content.size_ = 7;
  name_00.content.ptr = "union1";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_00);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d8,(Builder *)&f);
  _kjCondition.left = U0F0SP;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = "foo";
  _kjCondition.op.content.size_ = 4;
  name_05.content.size_ = 7;
  name_05.content.ptr = "u1f1sp";
  DynamicStruct::Builder::set((Builder *)local_4d8,name_05,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_01.content.size_ = 7;
  name_01.content.ptr = "union2";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_01);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d8,(Builder *)&f);
  _kjCondition.left = U0F0S8;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,1);
  name_06.content.size_ = 7;
  name_06.content.ptr = "u2f0s1";
  DynamicStruct::Builder::set((Builder *)local_4d8,name_06,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_02.content.size_ = 7;
  name_02.content.ptr = "union3";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_02);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d8,(Builder *)&f);
  _kjCondition.left = U0F0S16;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = (char *)0x112210f47de98115;
  name_07.content.size_ = 8;
  name_07.content.ptr = "u3f0s64";
  DynamicStruct::Builder::set((Builder *)local_4d8,name_07,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  StructBuilder::asReader(&root.builder);
  _kjCondition._0_8_ = root.schema.super_Schema.raw;
  Schema::requireUsableAs((Schema *)&_kjCondition,(RawSchema *)schemas::s_f47697362233ce52);
  uVar4 = _kjCondition._24_8_;
  pcVar11 = (char *)_kjCondition.op.content.size_;
  pEVar12 = (Exception *)_kjCondition.op.content.ptr;
  if ((uint)_local_830 < 0x10) {
    WVar7 = U0F0S0;
  }
  else {
    WVar7 = *(Which *)_kjCondition._24_8_;
  }
  _kjCondition.right = WVar7;
  _kjCondition.left = U0F1S32;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = WVar7 == U0F1S32;
  if (WVar7 != U0F1S32) {
    local_4d8 = (undefined1  [2])0xb;
    if ((uint)_local_830 < 0x10) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined2 *)uVar4;
    }
    local_2f8[0] = (char *)CONCAT62(local_2f8[0]._2_6_,uVar9);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>&,capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x155,FAILED,"(TestUnion::Union0::U0F1S32) == (reader.getUnion0().which())",
               "_kjCondition,TestUnion::Union0::U0F1S32, reader.getUnion0().which()",&_kjCondition,
               (Which *)local_4d8,(Which *)local_2f8);
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition._4_4_ = 0;
  if (0x5f < (uint)_local_830) {
    _kjCondition._4_4_ = *(int *)(uVar4 + 8);
  }
  _kjCondition.left = 0xd687;
  _kjCondition.right = 0x12;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition._4_4_ == 0x12d687;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    uVar10 = 0;
    f.exception._0_4_ = 0x12d687;
    if (0x5f < (uint)_local_830) {
      uVar10 = *(undefined4 *)(uVar4 + 8);
    }
    _local_4d8 = uVar10;
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"(1234567) == (reader.getUnion0().getU0f1s32())\", _kjCondition, 1234567, reader.getUnion0().getU0f1s32()"
               ,(char (*) [64])"failed: expected (1234567) == (reader.getUnion0().getU0f1s32())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&f,(int *)local_4d8);
  }
  if ((uint)_local_830 < 0x20) {
    _kjCondition.right = U0F0S0;
  }
  else {
    _kjCondition.right = *(Which *)(uVar4 + 2);
  }
  _kjCondition.left = U0F1S64;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == U0F1S64;
  if (_kjCondition.right == U0F1S64) {
    local_2f8[0] = "foo";
    if ((ushort)local_82c < 2) {
      local_668._16_4_ = 0x7fffffff;
      local_668.value.ownFile.content.ptr = (char *)0x0;
      local_668.value.ownFile.content.size_ = (size_t)(char *)0x0;
      f.exception = (Exception *)0x0;
    }
    else {
      local_668.value.ownFile.content.size_ = CONCAT71(uStack_837,local_838) + 8;
      local_668.value.ownFile.content.ptr = pcVar11;
      f.exception = pEVar12;
      local_668._16_4_ = local_828;
    }
    _local_4d8 = (ArrayPtr<const_char>)
                 PointerReader::getBlob<capnp::Text>((PointerReader *)&f,(void *)0x0,0);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (DebugExpression<char_const(&)[4]> *)local_2f8,(Reader *)local_4d8);
    if ((local_830 == '\0') && (kj::_::Debug::minSeverity < 3)) {
      if ((ushort)local_82c < 2) {
        pcVar11 = (char *)0x0;
        local_828 = 0x7fffffff;
        local_668.value.ownFile.content.size_ = (size_t)(char *)0x0;
        pEVar12 = (Exception *)0x0;
      }
      else {
        local_668.value.ownFile.content.size_ = CONCAT71(uStack_837,local_838) + 8;
      }
      f.exception = pEVar12;
      local_668.value.ownFile.content.ptr = pcVar11;
      local_668._16_4_ = local_828;
      _local_4d8 = (ArrayPtr<const_char>)
                   PointerReader::getBlob<capnp::Text>((PointerReader *)&f,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.getUnion1().getU1f1sp())\", _kjCondition, \"foo\", reader.getUnion1().getU1f1sp()"
                 ,(char (*) [61])"failed: expected (\"foo\") == (reader.getUnion1().getU1f1sp())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
                 (char (*) [4])"foo",(Reader *)local_4d8);
    }
    if ((uint)_local_830 < 0x30) {
      sVar8 = 0;
    }
    else {
      sVar8 = *(short *)(uVar4 + 4);
    }
    _kjCondition._0_8_ = (ulong)CONCAT42(_kjCondition._4_4_,sVar8) << 0x10;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    bVar13 = sVar8 == 0;
    _kjCondition.result = bVar13;
    if (bVar13) {
      if ((uint)_local_830 < 0x101) {
        bVar6 = 0;
      }
      else {
        bVar6 = *(byte *)(uVar4 + 0x20) & 1;
      }
      _kjCondition.left._0_1_ = bVar6;
      if ((bVar6 == 0) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x15c,ERROR,
                   "\"failed: expected \" \"reader.getUnion2().getU2f0s1()\", _kjCondition",
                   (char (*) [48])"failed: expected reader.getUnion2().getU2f0s1()",
                   (DebugExpression<bool> *)&_kjCondition);
      }
      if ((uint)_local_830 < 0x40) {
        WVar7 = U0F0S0;
      }
      else {
        WVar7 = *(Which *)(uVar4 + 6);
      }
      _kjCondition.right = WVar7;
      _kjCondition.left = U0F0S32;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = WVar7 == U0F0S32;
      if (WVar7 == U0F0S32) {
        if ((uint)_local_830 < 0x200) {
          _kjCondition.op.content.ptr = (char *)0x0;
        }
        else {
          _kjCondition.op.content.ptr = *(char **)(uVar4 + 0x38);
        }
        _kjCondition.left = 0x8115;
        _kjCondition.right = 0x7de9;
        _kjCondition._4_4_ = 0x112210f4;
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if ((_kjCondition.op.content.ptr != (char *)0x112210f47de98115) &&
           (kj::_::Debug::minSeverity < 3)) {
          f.exception = (Exception *)0x112210f47de98115;
          if ((uint)_local_830 < 0x200) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11 = *(char **)(uVar4 + 0x38);
          }
          _local_4d8 = pcVar11;
          kj::_::Debug::
          log<char_const(&)[78],kj::_::DebugComparison<long_long,long>&,long_long,long>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                     ,0x15f,ERROR,
                     "\"failed: expected \" \"(1234567890123456789ll) == (reader.getUnion3().getU3f0s64())\", _kjCondition, 1234567890123456789ll, reader.getUnion3().getU3f0s64()"
                     ,(char (*) [78])
                      "failed: expected (1234567890123456789ll) == (reader.getUnion3().getU3f0s64())"
                     ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&f,
                     (long *)local_4d8);
        }
        name_03.content.size_ = 8;
        name_03.content.ptr = "u0f1s32";
        DynamicStruct::Builder::get(&local_160,&root,name_03);
        DynamicValue::Builder::~Builder(&local_160);
        auVar1[0xf] = 0;
        auVar1._0_15_ = stack0xfffffffffffffb29;
        _local_4d8 = (ArrayPtr<const_char>)(auVar1 << 8);
        kj::Maybe<kj::Exception>::Maybe
                  ((Maybe<kj::Exception> *)&f,(Maybe<kj::Exception> *)local_4d8);
        cVar5 = (char)f.exception;
        kj::Maybe<kj::Exception>::Maybe
                  ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&f);
        if ((char)f.exception == '\x01') {
          kj::Exception::~Exception(&local_668.value);
        }
        if (local_4d8[0] == true) {
          kj::Exception::~Exception((Exception *)(auStack_4d6 + 6));
        }
        if ((cVar5 == '\0') && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::
          log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                     ,0x162,ERROR,
                     "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"u0f1s32\\\"); }) != kj::none\", _kjCondition"
                     ,(char (*) [89])
                      "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"u0f1s32\"); }) != kj::none"
                     ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition);
        }
        if ((undefined1)_kjCondition.left == U0F0S1) {
          kj::Exception::~Exception((Exception *)&_kjCondition.op);
        }
        local_340.type = INT;
        local_340.field_1.floatValue = 6.0995714218929e-318;
        name_08.content.size_ = 8;
        name_08.content.ptr = "u0f1s32";
        DynamicStruct::Builder::set(&root,name_08,&local_340);
        DynamicValue::Reader::~Reader(&local_340);
        auVar2[0xf] = 0;
        auVar2._0_15_ = stack0xfffffffffffffb29;
        _local_4d8 = (ArrayPtr<const_char>)(auVar2 << 8);
        kj::Maybe<kj::Exception>::Maybe
                  ((Maybe<kj::Exception> *)&f,(Maybe<kj::Exception> *)local_4d8);
        cVar5 = (char)f.exception;
        kj::Maybe<kj::Exception>::Maybe
                  ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&f);
        if ((char)f.exception == '\x01') {
          kj::Exception::~Exception(&local_668.value);
        }
        if (local_4d8[0] == true) {
          kj::Exception::~Exception((Exception *)(auStack_4d6 + 6));
        }
        if ((cVar5 == '\0') && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::
          log<char_const(&)[98],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                     ,0x163,ERROR,
                     "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.set(\\\"u0f1s32\\\", 1234567); }) != kj::none\", _kjCondition"
                     ,(char (*) [98])
                      "failed: expected ::kj::runCatchingExceptions([&]() { root.set(\"u0f1s32\", 1234567); }) != kj::none"
                     ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition);
        }
        if ((undefined1)_kjCondition.left == U0F0S1) {
          kj::Exception::~Exception((Exception *)&_kjCondition.op);
        }
        MallocMessageBuilder::~MallocMessageBuilder(&builder);
        return;
      }
      local_4d8 = (undefined1  [2])0x4;
      if ((uint)_local_830 < 0x40) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined2 *)(uVar4 + 6);
      }
      local_2f8[0] = (char *)CONCAT62(local_2f8[0]._2_6_,uVar9);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>&,capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x15e,FAILED,"(TestUnion::Union3::U3F0S64) == (reader.getUnion3().which())",
                 "_kjCondition,TestUnion::Union3::U3F0S64, reader.getUnion3().which()",
                 (DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,_capnproto_test::capnp::test::TestUnion::Union3::Which>
                  *)&_kjCondition,(Which *)local_4d8,(Which *)local_2f8);
      kj::_::Debug::Fault::fatal(&f);
    }
    auVar3._14_2_ = 0;
    auVar3._0_14_ = auStack_4d6._0_14_;
    _local_4d8 = (ArrayPtr<const_char>)(auVar3 << 0x10);
    if ((uint)_local_830 < 0x30) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined2 *)(uVar4 + 4);
    }
    local_2f8[0] = (char *)CONCAT62(local_2f8[0]._2_6_,uVar9);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,capnproto_test::capnp::test::TestUnion::Union2::Which>&,capnproto_test::capnp::test::TestUnion::Union2::Which,capnproto_test::capnp::test::TestUnion::Union2::Which>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x15b,FAILED,"(TestUnion::Union2::U2F0S1) == (reader.getUnion2().which())",
               "_kjCondition,TestUnion::Union2::U2F0S1, reader.getUnion2().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,_capnproto_test::capnp::test::TestUnion::Union2::Which>
                *)&_kjCondition,(Which *)local_4d8,(Which *)local_2f8);
    kj::_::Debug::Fault::fatal(&f);
  }
  local_4d8 = (undefined1  [2])0xc;
  if ((uint)_local_830 < 0x20) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(undefined2 *)(uVar4 + 2);
  }
  local_2f8[0] = (char *)CONCAT62(local_2f8[0]._2_6_,uVar9);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,capnproto_test::capnp::test::TestUnion::Union1::Which>&,capnproto_test::capnp::test::TestUnion::Union1::Which,capnproto_test::capnp::test::TestUnion::Union1::Which>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x158,FAILED,"(TestUnion::Union1::U1F1SP) == (reader.getUnion1().which())",
             "_kjCondition,TestUnion::Union1::U1F1SP, reader.getUnion1().which()",
             (DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,_capnproto_test::capnp::test::TestUnion::Union1::Which>
              *)&_kjCondition,(Which *)local_4d8,(Which *)local_2f8);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(DynamicApi, UnionsWrite) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestUnion>());

  root.get("union0").as<DynamicStruct>().set("u0f1s32", 1234567);
  root.get("union1").as<DynamicStruct>().set("u1f1sp", "foo");
  root.get("union2").as<DynamicStruct>().set("u2f0s1", true);
  root.get("union3").as<DynamicStruct>().set("u3f0s64", 1234567890123456789ll);

  auto reader = root.asReader().as<TestUnion>();
  ASSERT_EQ(TestUnion::Union0::U0F1S32, reader.getUnion0().which());
  EXPECT_EQ(1234567, reader.getUnion0().getU0f1s32());

  ASSERT_EQ(TestUnion::Union1::U1F1SP, reader.getUnion1().which());
  EXPECT_EQ("foo", reader.getUnion1().getU1f1sp());

  ASSERT_EQ(TestUnion::Union2::U2F0S1, reader.getUnion2().which());
  EXPECT_TRUE(reader.getUnion2().getU2f0s1());

  ASSERT_EQ(TestUnion::Union3::U3F0S64, reader.getUnion3().which());
  EXPECT_EQ(1234567890123456789ll, reader.getUnion3().getU3f0s64());

  // Can't access union members by name from the root.
  EXPECT_ANY_THROW(root.get("u0f1s32"));
  EXPECT_ANY_THROW(root.set("u0f1s32", 1234567));
}